

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O0

void __thiscall QMdiAreaPrivate::rearrange(QMdiAreaPrivate *this,Rearranger *rearranger)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  qsizetype qVar4;
  long to;
  const_iterator this_00;
  const_iterator o;
  QMdiSubWindow **ppQVar5;
  long *in_RSI;
  QMdiAreaPrivate *in_RDI;
  long in_FS_OFFSET;
  QMdiSubWindow *child;
  QList<QMdiSubWindow_*> *__range1;
  bool reverseList;
  int index;
  QMdiArea *q;
  QRect domain;
  const_iterator __end1;
  const_iterator __begin1;
  QSize minSubWindowSize;
  QList<QMdiSubWindow_*> subWindows;
  QList<QWidget_*> widgets;
  parameter_type in_stack_ffffffffffffff28;
  QSize *in_stack_ffffffffffffff30;
  QList<QMdi::Rearranger_*> *in_stack_ffffffffffffff40;
  QWidget *this_01;
  QWidget *this_02;
  undefined1 *local_88;
  QMdiAreaPrivate *in_stack_ffffffffffffff88;
  const_iterator minSubWindowSize_00;
  undefined1 *local_40;
  QMdiAreaPrivate *this_03;
  QList<QWidget_*> local_28;
  long *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI != (long *)0x0) {
    local_10 = in_RSI;
    q_func(in_RDI);
    bVar1 = QWidget::isVisible((QWidget *)0x61005c);
    if (bVar1) {
      local_28.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_28.d.ptr = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
      local_28.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      QList<QWidget_*>::QList((QList<QWidget_*> *)0x610123);
      (**(code **)(*local_10 + 8))();
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      this_03 = (QMdiAreaPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      subWindowList(in_stack_ffffffffffffff88,local_88._12_4_,local_88._11_1_);
      QSize::QSize(in_stack_ffffffffffffff30);
      this_02 = (QWidget *)&local_40;
      this_00 = QList<QMdiSubWindow_*>::begin((QList<QMdiSubWindow_*> *)in_stack_ffffffffffffff30);
      o = QList<QMdiSubWindow_*>::end((QList<QMdiSubWindow_*> *)in_stack_ffffffffffffff30);
      while( true ) {
        minSubWindowSize_00.i = o.i;
        bVar1 = QList<QMdiSubWindow_*>::const_iterator::operator!=
                          ((const_iterator *)&stack0xffffffffffffffb0,o);
        iVar3 = (int)((ulong)o.i >> 0x20);
        if (!bVar1) break;
        ppQVar5 = QList<QMdiSubWindow_*>::const_iterator::operator*
                            ((const_iterator *)&stack0xffffffffffffffb0);
        this_01 = &(*ppQVar5)->super_QWidget;
        bVar1 = sanityCheck((QMdiSubWindow *)in_stack_ffffffffffffff30,
                            (char *)in_stack_ffffffffffffff28);
        if ((bVar1) && (bVar1 = QWidget::isVisible((QWidget *)0x610263), bVar1)) {
          iVar3 = (**(code **)(*local_10 + 8))();
          if (iVar3 == 2) {
            bVar1 = QWidget::isMinimized(this_01);
            if ((bVar1) && (bVar1 = QMdiSubWindow::isShaded((QMdiSubWindow *)0x610299), !bVar1)) {
              QList<QWidget_*>::append((QList<QWidget_*> *)0x6102af,in_stack_ffffffffffffff28);
            }
          }
          else {
            bVar1 = QWidget::isMinimized(this_01);
            if ((!bVar1) || (bVar1 = QMdiSubWindow::isShaded((QMdiSubWindow *)0x6102ce), bVar1)) {
              bVar1 = QWidget::isMaximized(this_01);
              if ((bVar1) || (bVar1 = QMdiSubWindow::isShaded((QMdiSubWindow *)0x6102ef), bVar1)) {
                QWidget::showNormal((QWidget *)in_RDI);
              }
              QWidget::minimumSize(this_01);
              QSize::expandedTo((QSize *)in_RDI,in_stack_ffffffffffffff30);
              QMdiSubWindow::d_func((QMdiSubWindow *)0x61032f);
              QSize::expandedTo((QSize *)in_RDI,in_stack_ffffffffffffff30);
              QList<QWidget_*>::append((QList<QWidget_*> *)0x610367,in_stack_ffffffffffffff28);
            }
          }
        }
        QList<QMdiSubWindow_*>::const_iterator::operator++
                  ((const_iterator *)&stack0xffffffffffffffb0);
        o.i = minSubWindowSize_00.i;
      }
      stack0xffffffffffffff80 = &DAT_aaaaaaaaaaaaaaaa;
      local_88 = &DAT_aaaaaaaaaaaaaaaa;
      _local_88 = QWidget::rect(this_02);
      iVar2 = (**(code **)(*local_10 + 8))();
      if ((iVar2 == 0) && (bVar1 = QList<QWidget_*>::isEmpty((QList<QWidget_*> *)0x6103ce), !bVar1))
      {
        QList<QWidget_*>::size(&local_28);
        _local_88 = resizeToMinimumTileSize
                              ((QMdiAreaPrivate *)this_00.i,(QSize *)minSubWindowSize_00.i,iVar3);
      }
      (**(code **)*local_10)(local_10,&local_28,&local_88);
      iVar3 = (**(code **)(*local_10 + 8))();
      if ((iVar3 != 0) || (bVar1 = QList<QWidget_*>::isEmpty((QList<QWidget_*> *)0x61044b), bVar1))
      {
        iVar3 = (**(code **)(*local_10 + 8))();
        if (iVar3 == 1) {
          in_RDI->isSubWindowsTiled = false;
        }
      }
      else {
        in_RDI->isSubWindowsTiled = true;
        updateScrollBars(this_03);
      }
      QList<QMdiSubWindow_*>::~QList((QList<QMdiSubWindow_*> *)0x610490);
      QList<QWidget_*>::~QList((QList<QWidget_*> *)0x61049d);
    }
    else {
      qVar4 = QListSpecialMethodsBase<QMdi::Rearranger*>::indexOf<QMdi::Rearranger*>
                        ((QListSpecialMethodsBase<QMdi::Rearranger_*> *)in_stack_ffffffffffffff30,
                         (Rearranger **)in_stack_ffffffffffffff28,0x610081);
      if ((int)qVar4 == -1) {
        QList<QMdi::Rearranger_*>::append
                  ((QList<QMdi::Rearranger_*> *)0x6100e4,(parameter_type)in_stack_ffffffffffffff28);
      }
      else {
        to = (long)(int)qVar4;
        QList<QMdi::Rearranger_*>::size(&in_RDI->pendingRearrangements);
        QList<QMdi::Rearranger_*>::move(in_stack_ffffffffffffff40,(qsizetype)in_RDI,to);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiAreaPrivate::rearrange(Rearranger *rearranger)
{
    if (!rearranger)
        return;

    Q_Q(QMdiArea);
    if (!q->isVisible()) {
        // Compress if we already have the rearranger in the list.
        int index = pendingRearrangements.indexOf(rearranger);
        if (index != -1)
            pendingRearrangements.move(index, pendingRearrangements.size() - 1);
        else
            pendingRearrangements.append(rearranger);
        return;
    }

    QList<QWidget *> widgets;
    const bool reverseList = rearranger->type() == Rearranger::RegularTiler;
    const QList<QMdiSubWindow *> subWindows = subWindowList(activationOrder, reverseList);
    QSize minSubWindowSize;
    for (QMdiSubWindow *child : subWindows) {
        if (!sanityCheck(child, "QMdiArea::rearrange") || !child->isVisible())
            continue;
        if (rearranger->type() == Rearranger::IconTiler) {
            if (child->isMinimized() && !child->isShaded())
                widgets.append(child);
        } else {
            if (child->isMinimized() && !child->isShaded())
                continue;
            if (child->isMaximized() || child->isShaded())
                child->showNormal();
            minSubWindowSize = minSubWindowSize.expandedTo(child->minimumSize())
                               .expandedTo(child->d_func()->internalMinimumSize);
            widgets.append(child);
        }
    }

    QRect domain = viewport->rect();
    if (rearranger->type() == Rearranger::RegularTiler && !widgets.isEmpty())
        domain = resizeToMinimumTileSize(minSubWindowSize, widgets.size());

    rearranger->rearrange(widgets, domain);

    if (rearranger->type() == Rearranger::RegularTiler && !widgets.isEmpty()) {
        isSubWindowsTiled = true;
        updateScrollBars();
    } else if (rearranger->type() == Rearranger::SimpleCascader) {
        isSubWindowsTiled = false;
    }
}